

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageSparseBinding.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sparse::anon_unknown_4::ImageSparseBindingInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageSparseBindingInstance *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  DeviceDriver *pDVar3;
  ImageSparseBindingInstance *pIVar4;
  VkDeviceSize VVar5;
  bool bVar6;
  deUint32 dVar7;
  VkResult result;
  deUint32 dVar8;
  int iVar9;
  InstanceInterface *instance;
  VkPhysicalDevice physicalDevice;
  ulong uVar10;
  NotSupportedError *pNVar11;
  deUint32 valueNdx;
  undefined4 extraout_var;
  UVec3 *imageSize;
  ulong uVar12;
  long lVar13;
  deUint32 bufferOffset;
  deUint32 mipmapNdx;
  VkExtent3D VVar14;
  VkExtent3D extent;
  uint uVar15;
  undefined4 in_stack_fffffffffffff9bc;
  allocator<char> local_619;
  DeviceDriver *local_618;
  ImageSparseBindingInstance *local_610;
  TestStatus *local_608;
  Queue *local_600;
  Queue *local_5f8;
  TextureFormat *local_5f0;
  RefBase<vk::VkCommandBuffer_s_*> local_5e8;
  undefined1 local_5c8 [36];
  deUint32 local_5a4;
  deUint32 local_5a0;
  deUint32 local_59c;
  VkSampleCountFlagBits local_598;
  VkImageTiling VStack_594;
  VkImageUsageFlags VStack_590;
  VkSharingMode VStack_58c;
  deUint32 local_588;
  deUint32 *local_580;
  VkImageLayout local_578;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> bufferImageCopy;
  VkSparseImageOpaqueMemoryBindInfo opaqueBindInfo;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_518;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> outputBufferAlloc;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> inputBufferAlloc;
  VkImageSubresourceRange res_2;
  VkImageSubresourceRange res_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> referenceData;
  VkPipelineStageFlags stageBits [1];
  RefBase<vk::Handle<(vk::HandleType)8>_> local_478;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_458;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  VkMemoryRequirements imageSparseMemRequirements;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_408;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_3e8;
  VkBufferCreateInfo inputBufferCreateInfo;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_388;
  VkBufferCreateInfo outputBufferCreateInfo;
  VkBool32 local_2b8;
  ulong local_208;
  
  instance = Context::getInstanceInterface
                       ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imageSize = &this->m_imageSize;
  local_610 = this;
  bVar6 = isImageSizeSupported(instance,physicalDevice,this->m_imageType,imageSize);
  if (bVar6) {
    ::vk::getPhysicalDeviceFeatures
              ((VkPhysicalDeviceFeatures *)&outputBufferCreateInfo,instance,physicalDevice);
    if (local_2b8 != 0) {
      outputBufferCreateInfo.flags = 0;
      outputBufferCreateInfo._20_4_ = 0;
      outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      outputBufferCreateInfo._4_4_ = 0;
      outputBufferCreateInfo.pNext = (void *)0x0;
      inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
      inputBufferCreateInfo._4_4_ = 1;
      std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
      emplace_back<vkt::sparse::QueueRequirements>
                ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                  *)&outputBufferCreateInfo,(QueueRequirements *)&inputBufferCreateInfo);
      inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
      inputBufferCreateInfo._4_4_ = 1;
      std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
      emplace_back<vkt::sparse::QueueRequirements>
                ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                  *)&outputBufferCreateInfo,(QueueRequirements *)&inputBufferCreateInfo);
      pIVar4 = local_610;
      SparseResourcesBaseInstance::createDeviceSupportingQueues
                (&local_610->super_SparseResourcesBaseInstance,
                 (QueueRequirementsVec *)&outputBufferCreateInfo);
      std::
      _Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
      ::~_Vector_base((_Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                       *)&outputBufferCreateInfo);
      local_618 = (pIVar4->super_SparseResourcesBaseInstance).m_deviceDriver.
                  super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.
                  ptr;
      local_600 = SparseResourcesBaseInstance::getQueue
                            (&pIVar4->super_SparseResourcesBaseInstance,8,0);
      local_5f8 = SparseResourcesBaseInstance::getQueue
                            (&pIVar4->super_SparseResourcesBaseInstance,2,0);
      local_5c8._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
      local_5c8._8_8_ = (void *)0x0;
      local_5c8._16_4_ = 1;
      local_5c8._20_4_ = mapImageType(pIVar4->m_imageType);
      local_5f0 = &pIVar4->m_format;
      local_5c8._24_4_ = ::vk::mapTextureFormat(local_5f0);
      getLayerSize(pIVar4->m_imageType,imageSize);
      local_5c8._28_8_ = outputBufferCreateInfo._0_8_;
      local_5a4 = (deUint32)outputBufferCreateInfo.pNext;
      local_59c = getNumLayers(pIVar4->m_imageType,imageSize);
      local_578 = VK_IMAGE_LAYOUT_UNDEFINED;
      local_598 = VK_SAMPLE_COUNT_1_BIT;
      VStack_594 = VK_IMAGE_TILING_OPTIMAL;
      VStack_590 = 3;
      VStack_58c = VK_SHARING_MODE_EXCLUSIVE;
      local_588 = 0;
      local_580 = (deUint32 *)0x0;
      if (pIVar4->m_imageType - IMAGE_TYPE_CUBE < 2) {
        local_5c8._16_4_ = local_5c8._16_4_ | 0x10;
      }
      uVar15 = local_5c8._16_4_;
      (*instance->_vptr_InstanceInterface[4])
                (instance,physicalDevice,(ulong)(uint)local_5c8._24_4_,(ulong)(uint)local_5c8._20_4_
                 ,0,3,local_5c8._16_4_,(int)&outputBufferCreateInfo);
      local_5a0 = getImageMaxMipLevels
                            ((VkImageFormatProperties *)&outputBufferCreateInfo,
                             (VkExtent3D *)(local_5c8 + 0x1c));
      pIVar4 = local_610;
      pDVar3 = local_618;
      ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&outputBufferCreateInfo,
                        &local_618->super_DeviceInterface,
                        (local_610->super_SparseResourcesBaseInstance).m_logicalDevice.
                        super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkImageCreateInfo *)local_5c8
                        ,(VkAllocationCallbacks *)0x0);
      local_518.m_data.deleter.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
      local_518.m_data.deleter.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
      local_518.m_data.object.m_internal = outputBufferCreateInfo._0_8_;
      local_518.m_data.deleter.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
      outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      outputBufferCreateInfo._4_4_ = 0;
      outputBufferCreateInfo.pNext = (void *)0x0;
      outputBufferCreateInfo.flags = 0;
      outputBufferCreateInfo._20_4_ = 0;
      outputBufferCreateInfo.size = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&outputBufferCreateInfo);
      ::vk::createSemaphore
                ((Move<vk::Handle<(vk::HandleType)4>_> *)&outputBufferCreateInfo,
                 &pDVar3->super_DeviceInterface,
                 (pIVar4->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
      local_408.m_data.deleter.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
      local_408.m_data.deleter.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
      local_408.m_data.object.m_internal = outputBufferCreateInfo._0_8_;
      local_408.m_data.deleter.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
      outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      outputBufferCreateInfo._4_4_ = 0;
      outputBufferCreateInfo.pNext = (void *)0x0;
      outputBufferCreateInfo.flags = 0;
      outputBufferCreateInfo._20_4_ = 0;
      outputBufferCreateInfo.size = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)4>_> *)&outputBufferCreateInfo);
      ::vk::getImageMemoryRequirements
                (&imageSparseMemRequirements,&pDVar3->super_DeviceInterface,
                 (pIVar4->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (VkImage)local_518.m_data.object.m_internal);
      VVar5 = imageSparseMemRequirements.size;
      ::vk::getPhysicalDeviceProperties
                ((VkPhysicalDeviceProperties *)&outputBufferCreateInfo,instance,physicalDevice);
      if (local_208 < VVar5) {
        pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar11,"Required memory size for sparse resource exceeds device limits",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseBinding.cpp"
                   ,0xba);
        __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      inputBufferCreateInfo.flags = 0;
      inputBufferCreateInfo._20_4_ = 0;
      inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      inputBufferCreateInfo._4_4_ = 0;
      inputBufferCreateInfo.pNext = (void *)0x0;
      uVar10 = imageSparseMemRequirements.size / imageSparseMemRequirements.alignment;
      dVar7 = findMatchingMemoryType
                        (instance,physicalDevice,&imageSparseMemRequirements,
                         (MemoryRequirement *)&::vk::MemoryRequirement::Any);
      local_608 = __return_storage_ptr__;
      if (dVar7 == 0xffffffff) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&outputBufferCreateInfo,"No matching memory type found",
                   (allocator<char> *)&opaqueBindInfo);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&outputBufferCreateInfo);
        std::__cxx11::string::~string((string *)&outputBufferCreateInfo);
      }
      else {
        for (uVar12 = 0; uVar12 < (uVar10 & 0xffffffff); uVar12 = uVar12 + 1) {
          makeSparseMemoryBind
                    ((VkSparseMemoryBind *)&outputBufferCreateInfo,&local_618->super_DeviceInterface
                     ,(local_610->super_SparseResourcesBaseInstance).m_logicalDevice.
                      super_RefBase<vk::VkDevice_s_*>.m_data.object,
                     imageSparseMemRequirements.alignment,dVar7,
                     imageSparseMemRequirements.alignment * uVar12);
          local_3e8.m_data.object.m_internal =
               (deUint64)
               ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                         ((Handle<(vk::HandleType)7>)outputBufferCreateInfo._16_8_);
          local_3e8.m_data.deleter.m_device =
               (local_610->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object;
          local_3e8.m_data.deleter.m_deviceIface = &local_618->super_DeviceInterface;
          local_3e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
          makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>
                    ((sparse *)&opaqueBindInfo,(Move<vk::Handle<(vk::HandleType)7>_> *)&local_3e8);
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
          ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                      *)&deviceMemUniquePtrVec,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                     &opaqueBindInfo);
          de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr
                    ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                     &opaqueBindInfo);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_3e8);
          std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::push_back
                    ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                     &inputBufferCreateInfo,(value_type *)&outputBufferCreateInfo);
        }
        outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
        outputBufferCreateInfo.pNext = (void *)0x0;
        outputBufferCreateInfo._16_8_ = outputBufferCreateInfo._16_8_ & 0xffffffff00000000;
        outputBufferCreateInfo.size = 0;
        opaqueBindInfo.image.m_internal = local_518.m_data.object.m_internal;
        outputBufferCreateInfo.usage = 0;
        outputBufferCreateInfo.queueFamilyIndexCount = 0;
        outputBufferCreateInfo._44_4_ = 0;
        opaqueBindInfo.bindCount = (deUint32)uVar10;
        opaqueBindInfo.pBinds = (VkSparseMemoryBind *)inputBufferCreateInfo._0_8_;
        outputBufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
        result = (*(local_618->super_DeviceInterface)._vptr_DeviceInterface[0x11])
                           (local_618,local_600->queueHandle);
        ::vk::checkResult(result,
                          "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseBinding.cpp"
                          ,0xe3);
        __return_storage_ptr__ = local_608;
      }
      std::_Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
      ~_Vector_base((_Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *
                    )&inputBufferCreateInfo);
      pIVar4 = local_610;
      pDVar3 = local_618;
      if (dVar7 != 0xffffffff) {
        makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&outputBufferCreateInfo,
                        &local_618->super_DeviceInterface,
                        (local_610->super_SparseResourcesBaseInstance).m_logicalDevice.
                        super_RefBase<vk::VkDevice_s_*>.m_data.object,local_5f8->queueFamilyIndex);
        local_388.m_data.deleter.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
        local_388.m_data.deleter.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
        local_388.m_data.object.m_internal = outputBufferCreateInfo._0_8_;
        local_388.m_data.deleter.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
        outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        outputBufferCreateInfo._4_4_ = 0;
        outputBufferCreateInfo.pNext = (void *)0x0;
        outputBufferCreateInfo.flags = 0;
        outputBufferCreateInfo._20_4_ = 0;
        outputBufferCreateInfo.size = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&outputBufferCreateInfo);
        ::vk::allocateCommandBuffer
                  ((Move<vk::VkCommandBuffer_s_*> *)&outputBufferCreateInfo,
                   &pDVar3->super_DeviceInterface,
                   (pIVar4->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (VkCommandPool)local_388.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY
                  );
        local_5e8.m_data.deleter.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
        local_5e8.m_data.deleter.m_pool.m_internal = outputBufferCreateInfo.size;
        local_5e8.m_data.object = (VkCommandBuffer_s *)outputBufferCreateInfo._0_8_;
        local_5e8.m_data.deleter.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
        outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        outputBufferCreateInfo._4_4_ = 0;
        outputBufferCreateInfo.pNext = (void *)0x0;
        outputBufferCreateInfo.flags = 0;
        outputBufferCreateInfo._20_4_ = 0;
        outputBufferCreateInfo.size = 0;
        ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                  ((RefBase<vk::VkCommandBuffer_s_*> *)&outputBufferCreateInfo);
        std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::vector
                  (&bufferImageCopy,(ulong)local_5a0,(allocator_type *)&outputBufferCreateInfo);
        lVar13 = 0;
        dVar7 = 0;
        for (uVar10 = 0; uVar10 < local_5a0; uVar10 = uVar10 + 1) {
          dVar8 = (deUint32)uVar10;
          VVar14 = mipLevelExtents((VkExtent3D *)(local_5c8 + 0x1c),dVar8);
          extent.width = VVar14.depth;
          extent.height = extraout_var;
          extent.depth = local_59c;
          makeBufferImageCopy((VkBufferImageCopy *)&outputBufferCreateInfo,VVar14._0_8_,extent,dVar8
                              ,dVar7,CONCAT44(in_stack_fffffffffffff9bc,uVar15));
          *(ulong *)((long)&((bufferImageCopy.
                              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                              ._M_impl.super__Vector_impl_data._M_start)->imageExtent).height +
                    lVar13) =
               CONCAT44(outputBufferCreateInfo.pQueueFamilyIndices._4_4_,
                        outputBufferCreateInfo.pQueueFamilyIndices._0_4_);
          puVar1 = (undefined8 *)
                   ((long)&((bufferImageCopy.
                             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                             ._M_impl.super__Vector_impl_data._M_start)->imageOffset).x + lVar13);
          *puVar1 = CONCAT44(outputBufferCreateInfo.sharingMode,outputBufferCreateInfo.usage);
          puVar1[1] = outputBufferCreateInfo._40_8_;
          puVar1 = (undefined8 *)
                   ((long)&((bufferImageCopy.
                             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                             ._M_impl.super__Vector_impl_data._M_start)->imageSubresource).
                           aspectMask + lVar13);
          *puVar1 = outputBufferCreateInfo._16_8_;
          puVar1[1] = outputBufferCreateInfo.size;
          puVar1 = (undefined8 *)
                   ((long)&(bufferImageCopy.
                            super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bufferOffset + lVar13);
          *puVar1 = outputBufferCreateInfo._0_8_;
          puVar1[1] = outputBufferCreateInfo.pNext;
          dVar8 = getImageMipLevelSizeInBytes
                            ((VkExtent3D *)(local_5c8 + 0x1c),local_59c,local_5f0,dVar8,4);
          dVar7 = dVar7 + dVar8;
          lVar13 = lVar13 + 0x38;
        }
        beginCommandBuffer(&local_618->super_DeviceInterface,local_5e8.m_data.object);
        dVar7 = getImageSizeInBytes((VkExtent3D *)(local_5c8 + 0x1c),local_59c,local_5f0,local_5a0,4
                                   );
        uVar12 = (ulong)dVar7;
        makeBufferCreateInfo(&inputBufferCreateInfo,uVar12,1);
        pIVar4 = local_610;
        pDVar3 = local_618;
        ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&outputBufferCreateInfo,
                           &local_618->super_DeviceInterface,
                           (local_610->super_SparseResourcesBaseInstance).m_logicalDevice.
                           super_RefBase<vk::VkDevice_s_*>.m_data.object,&inputBufferCreateInfo,
                           (VkAllocationCallbacks *)0x0);
        local_458.m_data.deleter.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
        local_458.m_data.deleter.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
        local_458.m_data.object.m_internal = outputBufferCreateInfo._0_8_;
        local_458.m_data.deleter.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
        outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        outputBufferCreateInfo._4_4_ = 0;
        outputBufferCreateInfo.pNext = (void *)0x0;
        outputBufferCreateInfo.flags = 0;
        outputBufferCreateInfo._20_4_ = 0;
        outputBufferCreateInfo.size = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&outputBufferCreateInfo);
        bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                   &outputBufferCreateInfo,&pDVar3->super_DeviceInterface,
                   (pIVar4->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (pIVar4->super_SparseResourcesBaseInstance).m_allocator.
                   super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
                   (VkBuffer)local_458.m_data.object.m_internal,(MemoryRequirement)0x1);
        inputBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
        m_data.ptr = (Allocation *)outputBufferCreateInfo._0_8_;
        outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        outputBufferCreateInfo._4_4_ = 0;
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                   &outputBufferCreateInfo);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&referenceData,uVar12,(allocator_type *)&outputBufferCreateInfo);
        for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
          referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] =
               (char)(uVar10 % imageSparseMemRequirements.alignment) + '\x01';
        }
        memcpy((inputBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr,
               referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,uVar12);
        ::vk::flushMappedMemoryRange
                  (&local_618->super_DeviceInterface,
                   (local_610->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (VkDeviceMemory)
                   ((inputBufferAlloc.
                     super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                    ptr)->m_memory).m_internal,
                   (inputBufferAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->m_offset,uVar12);
        makeBufferMemoryBarrier
                  ((VkBufferMemoryBarrier *)&outputBufferCreateInfo,0x4000,0x800,
                   (VkBuffer)local_458.m_data.object.m_internal,0,uVar12);
        (*(local_618->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                  (local_618,local_5e8.m_data.object,0x4000,0x1000,0,0,0,1,
                   (int)(VkBufferMemoryBarrier *)&outputBufferCreateInfo,0,0);
        dVar8 = local_5f8->queueFamilyIndex;
        dVar7 = local_600->queueFamilyIndex;
        if (local_600->queueFamilyIndex == local_5f8->queueFamilyIndex) {
          dVar8 = 0xffffffff;
          dVar7 = 0xffffffff;
        }
        subresourceRange_00.levelCount = local_5a0;
        subresourceRange_00.aspectMask = 1;
        subresourceRange_00.baseMipLevel = 0;
        subresourceRange_00.baseArrayLayer = 0;
        subresourceRange_00.layerCount = local_59c;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&outputBufferCreateInfo,0,0x1000,
                   VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,dVar7,dVar8,
                   (VkImage)local_518.m_data.object.m_internal,subresourceRange_00);
        pDVar3 = local_618;
        (*(local_618->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                  (local_618,local_5e8.m_data.object,1,0x1000,0,0,0,0,0,1,
                   (int)(VkImageMemoryBarrier *)&outputBufferCreateInfo);
        (*(pDVar3->super_DeviceInterface)._vptr_DeviceInterface[0x62])
                  (pDVar3,local_5e8.m_data.object,local_458.m_data.object.m_internal,
                   local_518.m_data.object.m_internal,7,
                   ((long)bufferImageCopy.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)bufferImageCopy.
                         super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,
                   (int)bufferImageCopy.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        subresourceRange.levelCount = local_5a0;
        subresourceRange.aspectMask = 1;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.baseArrayLayer = 0;
        subresourceRange.layerCount = local_59c;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&outputBufferCreateInfo,0x1000,0x800,
                   VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                   (VkImage)local_518.m_data.object.m_internal,subresourceRange);
        (*(local_618->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                  (local_618,local_5e8.m_data.object,0x1000,0x1000,0,0,0,0,0,1,
                   (int)(VkImageMemoryBarrier *)&outputBufferCreateInfo);
        makeBufferCreateInfo(&outputBufferCreateInfo,uVar12,2);
        pIVar4 = local_610;
        pDVar3 = local_618;
        ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&opaqueBindInfo,
                           &local_618->super_DeviceInterface,
                           (local_610->super_SparseResourcesBaseInstance).m_logicalDevice.
                           super_RefBase<vk::VkDevice_s_*>.m_data.object,&outputBufferCreateInfo,
                           (VkAllocationCallbacks *)0x0);
        local_478.m_data.deleter.m_device = (VkDevice)opaqueBindInfo.pBinds;
        local_478.m_data.object.m_internal = opaqueBindInfo.image.m_internal;
        local_478.m_data.deleter.m_deviceIface = (DeviceInterface *)opaqueBindInfo._8_8_;
        opaqueBindInfo.image.m_internal = 0;
        opaqueBindInfo.bindCount = 0;
        opaqueBindInfo._12_4_ = 0;
        opaqueBindInfo.pBinds = (VkSparseMemoryBind *)0x0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&opaqueBindInfo);
        bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&opaqueBindInfo,
                   &pDVar3->super_DeviceInterface,
                   (pIVar4->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (pIVar4->super_SparseResourcesBaseInstance).m_allocator.
                   super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
                   (VkBuffer)local_478.m_data.object.m_internal,(MemoryRequirement)0x1);
        outputBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
        m_data.ptr = (Allocation *)opaqueBindInfo.image;
        opaqueBindInfo.image.m_internal = 0;
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                   &opaqueBindInfo);
        (*(pDVar3->super_DeviceInterface)._vptr_DeviceInterface[99])
                  (pDVar3,local_5e8.m_data.object,local_518.m_data.object.m_internal,6,
                   local_478.m_data.object.m_internal,
                   ((long)bufferImageCopy.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)bufferImageCopy.
                         super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,
                   (int)bufferImageCopy.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        pIVar4 = local_610;
        makeBufferMemoryBarrier
                  ((VkBufferMemoryBarrier *)&opaqueBindInfo,0x1000,0x2000,
                   (VkBuffer)local_478.m_data.object.m_internal,0,uVar12);
        (*(pDVar3->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                  (pDVar3,local_5e8.m_data.object,0x1000,0x4000,0,0,0,1,
                   (int)(VkBufferMemoryBarrier *)&opaqueBindInfo,0,0);
        endCommandBuffer(&pDVar3->super_DeviceInterface,local_5e8.m_data.object);
        stageBits[0] = 0x1000;
        submitCommandsAndWait
                  (&pDVar3->super_DeviceInterface,
                   (pIVar4->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,local_5f8->queueHandle,
                   local_5e8.m_data.object,1,(VkSemaphore *)&local_408,stageBits,0,
                   (VkSemaphore *)0x0);
        ::vk::invalidateMappedMemoryRange
                  (&pDVar3->super_DeviceInterface,
                   (pIVar4->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (VkDeviceMemory)
                   ((outputBufferAlloc.
                     super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                    ptr)->m_memory).m_internal,
                   (outputBufferAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->m_offset,uVar12);
        pvVar2 = (outputBufferAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_hostPtr;
        (*(pDVar3->super_DeviceInterface)._vptr_DeviceInterface[3])(pDVar3,local_600->queueHandle);
        lVar13 = 0;
        uVar10 = 0;
        do {
          if (local_5a0 <= uVar10) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&opaqueBindInfo,"Passed",&local_619);
            __return_storage_ptr__ = local_608;
            tcu::TestStatus::pass(local_608,(string *)&opaqueBindInfo);
            goto LAB_006f97d1;
          }
          dVar7 = getImageMipLevelSizeInBytes
                            ((VkExtent3D *)(local_5c8 + 0x1c),local_59c,local_5f0,(deUint32)uVar10,1
                            );
          uVar12 = (ulong)*(uint *)((long)&(bufferImageCopy.
                                            super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->bufferOffset
                                   + lVar13);
          iVar9 = bcmp((void *)((long)pvVar2 + uVar12),
                       referenceData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar12,(ulong)dVar7);
          uVar10 = uVar10 + 1;
          lVar13 = lVar13 + 0x38;
        } while (iVar9 == 0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&opaqueBindInfo,"Failed",&local_619);
        __return_storage_ptr__ = local_608;
        tcu::TestStatus::fail(local_608,(string *)&opaqueBindInfo);
LAB_006f97d1:
        std::__cxx11::string::~string((string *)&opaqueBindInfo);
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  (&outputBufferAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_478);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
        ;
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  (&inputBufferAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_458);
        std::_Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::
        ~_Vector_base(&bufferImageCopy.
                       super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                     );
        ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_5e8);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_388);
      }
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_408);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_518);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
      ::~vector(&deviceMemUniquePtrVec);
      return __return_storage_ptr__;
    }
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar11,"Device does not support sparse binding",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseBinding.cpp"
               ,0x7e);
  }
  else {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar11,"Image size not supported for device",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseBinding.cpp"
               ,0x7a);
  }
  __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus ImageSparseBindingInstance::iterate (void)
{
	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();
	VkImageCreateInfo			imageSparseInfo;
	std::vector<DeviceMemorySp>	deviceMemUniquePtrVec;

	// Check if image size does not exceed device limits
	if (!isImageSizeSupported(instance, physicalDevice, m_imageType, m_imageSize))
		TCU_THROW(NotSupportedError, "Image size not supported for device");

	// Check if device supports sparse binding
	if (!getPhysicalDeviceFeatures(instance, physicalDevice).sparseBinding)
		TCU_THROW(NotSupportedError, "Device does not support sparse binding");

	{
		// Create logical device supporting both sparse and compute queues
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	imageSparseInfo.sType					= VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;					//VkStructureType		sType;
	imageSparseInfo.pNext					= DE_NULL;												//const void*			pNext;
	imageSparseInfo.flags					= VK_IMAGE_CREATE_SPARSE_BINDING_BIT;					//VkImageCreateFlags	flags;
	imageSparseInfo.imageType				= mapImageType(m_imageType);							//VkImageType			imageType;
	imageSparseInfo.format					= mapTextureFormat(m_format);							//VkFormat				format;
	imageSparseInfo.extent					= makeExtent3D(getLayerSize(m_imageType, m_imageSize));	//VkExtent3D			extent;
	imageSparseInfo.arrayLayers				= getNumLayers(m_imageType, m_imageSize);				//deUint32				arrayLayers;
	imageSparseInfo.samples					= VK_SAMPLE_COUNT_1_BIT;								//VkSampleCountFlagBits	samples;
	imageSparseInfo.tiling					= VK_IMAGE_TILING_OPTIMAL;								//VkImageTiling			tiling;
	imageSparseInfo.initialLayout			= VK_IMAGE_LAYOUT_UNDEFINED;							//VkImageLayout			initialLayout;
	imageSparseInfo.usage					= VK_IMAGE_USAGE_TRANSFER_SRC_BIT |
											  VK_IMAGE_USAGE_TRANSFER_DST_BIT;						//VkImageUsageFlags		usage;
	imageSparseInfo.sharingMode				= VK_SHARING_MODE_EXCLUSIVE;							//VkSharingMode			sharingMode;
	imageSparseInfo.queueFamilyIndexCount	= 0u;													//deUint32				queueFamilyIndexCount;
	imageSparseInfo.pQueueFamilyIndices		= DE_NULL;												//const deUint32*		pQueueFamilyIndices;

	if (m_imageType == IMAGE_TYPE_CUBE || m_imageType == IMAGE_TYPE_CUBE_ARRAY)
	{
		imageSparseInfo.flags |= VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;
	}

	{
		VkImageFormatProperties imageFormatProperties;
		instance.getPhysicalDeviceImageFormatProperties(physicalDevice,
			imageSparseInfo.format,
			imageSparseInfo.imageType,
			imageSparseInfo.tiling,
			imageSparseInfo.usage,
			imageSparseInfo.flags,
			&imageFormatProperties);

		imageSparseInfo.mipLevels = getImageMaxMipLevels(imageFormatProperties, imageSparseInfo.extent);
	}

	// Create sparse image
	const Unique<VkImage> imageSparse(createImage(deviceInterface, getDevice(), &imageSparseInfo));

	// Create sparse image memory bind semaphore
	const Unique<VkSemaphore> imageMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	// Get sparse image general memory requirements
	const VkMemoryRequirements imageSparseMemRequirements = getImageMemoryRequirements(deviceInterface, getDevice(), *imageSparse);

	// Check if required image memory size does not exceed device limits
	if (imageSparseMemRequirements.size > getPhysicalDeviceProperties(instance, physicalDevice).limits.sparseAddressSpaceSize)
		TCU_THROW(NotSupportedError, "Required memory size for sparse resource exceeds device limits");

	DE_ASSERT((imageSparseMemRequirements.size % imageSparseMemRequirements.alignment) == 0);

	{
		std::vector<VkSparseMemoryBind>	sparseMemoryBinds;
		const deUint32					numSparseBinds	= static_cast<deUint32>(imageSparseMemRequirements.size / imageSparseMemRequirements.alignment);
		const deUint32					memoryType		= findMatchingMemoryType(instance, physicalDevice, imageSparseMemRequirements, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		for (deUint32 sparseBindNdx = 0; sparseBindNdx < numSparseBinds; ++sparseBindNdx)
		{
			const VkSparseMemoryBind sparseMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(),
				imageSparseMemRequirements.alignment, memoryType, imageSparseMemRequirements.alignment * sparseBindNdx);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(sparseMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			sparseMemoryBinds.push_back(sparseMemoryBind);
		}

		const VkSparseImageOpaqueMemoryBindInfo opaqueBindInfo = makeSparseImageOpaqueMemoryBindInfo(*imageSparse, numSparseBinds, &sparseMemoryBinds[0]);

		const VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			0u,											//deUint32									bufferBindCount;
			DE_NULL,									//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			1u,											//deUint32									imageOpaqueBindCount;
			&opaqueBindInfo,							//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&imageMemoryBindSemaphore.get()				//const VkSemaphore*						pSignalSemaphores;
		};

		// Submit sparse bind commands for execution
		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create command buffer for compute and transfer oparations
	const Unique<VkCommandPool>	  commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer> commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	std::vector<VkBufferImageCopy> bufferImageCopy(imageSparseInfo.mipLevels);

	{
		deUint32 bufferOffset = 0;
		for (deUint32 mipmapNdx = 0; mipmapNdx < imageSparseInfo.mipLevels; mipmapNdx++)
		{
			bufferImageCopy[mipmapNdx] = makeBufferImageCopy(mipLevelExtents(imageSparseInfo.extent, mipmapNdx), imageSparseInfo.arrayLayers, mipmapNdx, static_cast<VkDeviceSize>(bufferOffset));
			bufferOffset += getImageMipLevelSizeInBytes(imageSparseInfo.extent, imageSparseInfo.arrayLayers, m_format, mipmapNdx, BUFFER_IMAGE_COPY_OFFSET_GRANULARITY);
		}
	}

	// Start recording commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	const deUint32					imageSizeInBytes		= getImageSizeInBytes(imageSparseInfo.extent, imageSparseInfo.arrayLayers, m_format, imageSparseInfo.mipLevels, BUFFER_IMAGE_COPY_OFFSET_GRANULARITY);
	const VkBufferCreateInfo		inputBufferCreateInfo	= makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT);
	const Unique<VkBuffer>			inputBuffer				(createBuffer(deviceInterface, getDevice(), &inputBufferCreateInfo));
	const de::UniquePtr<Allocation>	inputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *inputBuffer, MemoryRequirement::HostVisible));

	std::vector<deUint8> referenceData(imageSizeInBytes);

	for (deUint32 valueNdx = 0; valueNdx < imageSizeInBytes; ++valueNdx)
	{
		referenceData[valueNdx] = static_cast<deUint8>((valueNdx % imageSparseMemRequirements.alignment) + 1u);
	}

	deMemcpy(inputBufferAlloc->getHostPtr(), &referenceData[0], imageSizeInBytes);

	flushMappedMemoryRange(deviceInterface, getDevice(), inputBufferAlloc->getMemory(), inputBufferAlloc->getOffset(), imageSizeInBytes);

	{
		const VkBufferMemoryBarrier inputBufferBarrier = makeBufferMemoryBarrier
		(
			VK_ACCESS_HOST_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			*inputBuffer,
			0u,
			imageSizeInBytes
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 1u, &inputBufferBarrier, 0u, DE_NULL);
	}

	{
		const VkImageMemoryBarrier imageSparseTransferDstBarrier = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? sparseQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? computeQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			*imageSparse,
			makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, imageSparseInfo.mipLevels, 0u, imageSparseInfo.arrayLayers)
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &imageSparseTransferDstBarrier);
	}

	deviceInterface.cmdCopyBufferToImage(*commandBuffer, *inputBuffer, *imageSparse, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, static_cast<deUint32>(bufferImageCopy.size()), &bufferImageCopy[0]);

	{
		const VkImageMemoryBarrier imageSparseTransferSrcBarrier = makeImageMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*imageSparse,
			makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, imageSparseInfo.mipLevels, 0u, imageSparseInfo.arrayLayers)
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &imageSparseTransferSrcBarrier);
	}

	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	deviceInterface.cmdCopyImageToBuffer(*commandBuffer, *imageSparse, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *outputBuffer, static_cast<deUint32>(bufferImageCopy.size()), &bufferImageCopy[0]);

	{
		const VkBufferMemoryBarrier outputBufferBarrier = makeBufferMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_HOST_READ_BIT,
			*outputBuffer,
			0u,
			imageSizeInBytes
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferBarrier, 0u, DE_NULL);
	}

	// End recording commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	const VkPipelineStageFlags stageBits[] = { VK_PIPELINE_STAGE_TRANSFER_BIT };

	// Submit commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &imageMemoryBindSemaphore.get(), stageBits);

	// Retrieve data from buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), imageSizeInBytes);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	for (deUint32 mipmapNdx = 0; mipmapNdx < imageSparseInfo.mipLevels; ++mipmapNdx)
	{
		const deUint32 mipLevelSizeInBytes	= getImageMipLevelSizeInBytes(imageSparseInfo.extent, imageSparseInfo.arrayLayers, m_format, mipmapNdx);
		const deUint32 bufferOffset			= static_cast<deUint32>(bufferImageCopy[mipmapNdx].bufferOffset);

		if (deMemCmp(outputData + bufferOffset, &referenceData[bufferOffset], mipLevelSizeInBytes) != 0)
			return tcu::TestStatus::fail("Failed");
	}

	return tcu::TestStatus::pass("Passed");
}